

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

void __thiscall Fl_Menu_::clear(Fl_Menu_ *this)

{
  int iVar1;
  int local_14;
  int i;
  Fl_Menu_ *this_local;
  
  if (this->alloc != '\0') {
    if (1 < this->alloc) {
      local_14 = size(this);
      while (iVar1 = local_14 + -1, local_14 != 0) {
        local_14 = iVar1;
        if (this->menu_[iVar1].text != (char *)0x0) {
          free(this->menu_[iVar1].text);
        }
      }
    }
    if (this == fl_menu_array_owner) {
      fl_menu_array_owner = (Fl_Menu_ *)0x0;
    }
    else if (this->menu_ != (Fl_Menu_Item *)0x0) {
      operator_delete__(this->menu_);
    }
    this->menu_ = (Fl_Menu_Item *)0x0;
    this->value_ = (Fl_Menu_Item *)0x0;
    this->alloc = '\0';
  }
  return;
}

Assistant:

void Fl_Menu_::clear() {
  if (alloc) {
    if (alloc>1) for (int i = size(); i--;)
      if (menu_[i].text) free((void*)menu_[i].text);
    if (this == fl_menu_array_owner)
      fl_menu_array_owner = 0;
    else
      delete[] menu_;
    menu_ = 0;
    value_ = 0;
    alloc = 0;
  }
}